

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

void __thiscall jbcoin::STAmount::setJson(STAmount *this,Value *elem)

{
  Value *pVVar1;
  Currency *currency;
  AccountID *v;
  Value VStack_48;
  string local_38;
  
  Json::Value::Value((Value *)&local_38,objectValue);
  Json::Value::swap(elem,(Value *)&local_38);
  Json::Value::~Value((Value *)&local_38);
  if (this->mIsNative == false) {
    (*(this->super_STBase)._vptr_STBase[6])(&local_38,this);
    Json::Value::Value(&VStack_48,&local_38);
    pVVar1 = Json::Value::operator[](elem,(StaticString *)&jss::value);
    Json::Value::swap(pVVar1,&VStack_48);
    Json::Value::~Value(&VStack_48);
    std::__cxx11::string::~string((string *)&local_38);
    to_string_abi_cxx11_(&local_38,(jbcoin *)&this->mIssue,currency);
    Json::Value::Value(&VStack_48,&local_38);
    pVVar1 = Json::Value::operator[](elem,(StaticString *)&jss::currency);
    Json::Value::swap(pVVar1,&VStack_48);
    Json::Value::~Value(&VStack_48);
    std::__cxx11::string::~string((string *)&local_38);
    toBase58_abi_cxx11_(&local_38,(jbcoin *)&(this->mIssue).account,v);
    Json::Value::Value(&VStack_48,&local_38);
    pVVar1 = Json::Value::operator[](elem,(StaticString *)&jss::issuer);
    Json::Value::swap(pVVar1,&VStack_48);
  }
  else {
    (*(this->super_STBase)._vptr_STBase[6])(&local_38,this);
    Json::Value::Value(&VStack_48,&local_38);
    Json::Value::swap(elem,&VStack_48);
  }
  Json::Value::~Value(&VStack_48);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void STAmount::setJson (Json::Value& elem) const
{
    elem = Json::objectValue;

    if (!mIsNative)
    {
        // It is an error for currency or issuer not to be specified for valid
        // json.
        elem[jss::value]      = getText ();
        elem[jss::currency]   = to_string (mIssue.currency);
        elem[jss::issuer]     = to_string (mIssue.account);
    }
    else
    {
        elem = getText ();
    }
}